

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_init(BuildCtx *ctx,int maxsection)

{
  long lVar1;
  dasm_State *pdVar2;
  size_t _need;
  size_t _sz;
  size_t psz;
  dasm_State *D;
  int maxsection_local;
  BuildCtx *ctx_local;
  
  _sz = 0;
  ctx->D = (dasm_State *)0x0;
  lVar1 = (long)(maxsection + -1) * 0x28;
  if (lVar1 != -0x78) {
    for (_need = 0x10; _need < lVar1 + 0x78U; _need = _need * 2) {
    }
    pdVar2 = (dasm_State *)realloc(ctx->D,_need);
    ctx->D = pdVar2;
    if (ctx->D == (dasm_State *)0x0) {
      exit(1);
    }
    _sz = _need;
  }
  pdVar2 = ctx->D;
  pdVar2->psize = _sz;
  pdVar2->lglabels = (int *)0x0;
  pdVar2->lgsize = 0;
  pdVar2->pclabels = (int *)0x0;
  pdVar2->pcsize = 0;
  pdVar2->globals = (void **)0x0;
  pdVar2->maxsection = maxsection;
  memset(pdVar2->sections,0,(long)maxsection * 0x28);
  return;
}

Assistant:

void dasm_init(Dst_DECL, int maxsection)
{
  dasm_State *D;
  size_t psz = 0;
  Dst_REF = NULL;
  DASM_M_GROW(Dst, struct dasm_State, Dst_REF, psz, DASM_PSZ(maxsection));
  D = Dst_REF;
  D->psize = psz;
  D->lglabels = NULL;
  D->lgsize = 0;
  D->pclabels = NULL;
  D->pcsize = 0;
  D->globals = NULL;
  D->maxsection = maxsection;
  memset((void *)D->sections, 0, maxsection * sizeof(dasm_Section));
}